

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O3

void __thiscall
quic::Bbr2ProbeBwMode::EnterProbeDown
          (Bbr2ProbeBwMode *this,bool probed_too_high,bool stopped_risky_probe,QuicTime now)

{
  Bbr2Sender *pBVar1;
  long lVar2;
  uint64_t uVar3;
  
  this->last_cycle_probed_too_high_ = probed_too_high;
  this->last_cycle_stopped_risky_probe_ = stopped_risky_probe;
  (this->cycle_).cycle_start_time.time_ = now.time_;
  (this->cycle_).phase = PROBE_DOWN;
  (this->cycle_).rounds_in_phase = 0;
  (this->cycle_).phase_start_time.time_ = now.time_;
  pBVar1 = (this->super_Bbr2ModeBase).sender_;
  pBVar1->connection_stats_->bbr_num_cycles = pBVar1->connection_stats_->bbr_num_cycles + 1;
  uVar3 = Bbr2Sender::RandomUint64(pBVar1,(pBVar1->params_).probe_bw_max_probe_rand_rounds);
  (this->cycle_).rounds_since_probe = uVar3;
  pBVar1 = (this->super_Bbr2ModeBase).sender_;
  lVar2 = (pBVar1->params_).probe_bw_probe_base_duration.time_offset_;
  uVar3 = Bbr2Sender::RandomUint64
                    (pBVar1,(pBVar1->params_).probe_bw_probe_max_rand_duration.time_offset_);
  (this->cycle_).probe_wait_time.time_offset_ = uVar3 + lVar2;
  (this->cycle_).probe_up_bytes = 0xffffffffffffffff;
  (this->cycle_).has_advanced_max_bw = false;
  Bbr2NetworkModel::RestartRound((this->super_Bbr2ModeBase).model_);
  return;
}

Assistant:

void Bbr2ProbeBwMode::EnterProbeDown(bool probed_too_high,
                                     bool stopped_risky_probe,
                                     QuicTime now) {
  /*QUIC_DVLOG(2) << sender_ << " Phase change: " << cycle_.phase << " ==> "
                << CyclePhase::PROBE_DOWN << " after "
                << now - cycle_.phase_start_time << ", or "
                << cycle_.rounds_in_phase
                << " rounds. probed_too_high:" << probed_too_high
                << ", stopped_risky_probe:" << stopped_risky_probe << "  @ "
                << now;*/
  last_cycle_probed_too_high_ = probed_too_high;
  last_cycle_stopped_risky_probe_ = stopped_risky_probe;

  cycle_.cycle_start_time = now;
  cycle_.phase = CyclePhase::PROBE_DOWN;
  cycle_.rounds_in_phase = 0;
  cycle_.phase_start_time = now;
  ++sender_->connection_stats_->bbr_num_cycles;

  // Pick probe wait time.
  cycle_.rounds_since_probe =
      sender_->RandomUint64(Params().probe_bw_max_probe_rand_rounds);
  cycle_.probe_wait_time =
      Params().probe_bw_probe_base_duration +
      QuicTime::Delta::FromMicroseconds(sender_->RandomUint64(
          Params().probe_bw_probe_max_rand_duration.ToMicroseconds()));

  cycle_.probe_up_bytes = std::numeric_limits<QuicByteCount>::max();
  cycle_.has_advanced_max_bw = false;
  model_->RestartRound();
}